

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall
HighsSparseMatrix::considerColScaling
          (HighsSparseMatrix *this,HighsInt max_scale_factor_exponent,double *col_scale)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar8 = ldexp(1.0,max_scale_factor_exponent);
  if ((this->format_ == kColwise) && (0 < this->num_col_)) {
    lVar7 = 0;
    do {
      piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar3[lVar7];
      lVar5 = (long)iVar1;
      iVar2 = piVar3[lVar7 + 1];
      dVar10 = 0.0;
      if (iVar1 < iVar2) {
        do {
          dVar9 = ABS((this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5]);
          if (dVar10 <= dVar9) {
            dVar10 = dVar9;
          }
          lVar5 = lVar5 + 1;
        } while (iVar2 != lVar5);
      }
      lVar5 = lVar7 + 1;
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        dVar10 = log(1.0 / dVar10);
        dVar10 = floor(dVar10 / 0.6931471805599453 + 0.5);
        dVar10 = exp2(dVar10);
        if (dVar10 <= 1.0 / dVar8) {
          dVar10 = 1.0 / dVar8;
        }
        dVar9 = dVar8;
        if (dVar10 <= dVar8) {
          dVar9 = dVar10;
        }
        col_scale[lVar7] = dVar9;
        piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar3[lVar7];
        lVar6 = (long)iVar1;
        iVar2 = piVar3[lVar5];
        if (iVar1 < iVar2) {
          pdVar4 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            pdVar4[lVar6] = col_scale[lVar7] * pdVar4[lVar6];
            lVar6 = lVar6 + 1;
          } while (iVar2 != lVar6);
        }
      }
      else {
        col_scale[lVar7] = 1.0;
      }
      lVar7 = lVar5;
    } while (lVar5 < this->num_col_);
  }
  return;
}

Assistant:

void HighsSparseMatrix::considerColScaling(
    const HighsInt max_scale_factor_exponent, double* col_scale) {
  const double log2 = log(2.0);
  const double max_allow_scale = pow(2.0, max_scale_factor_exponent);
  const double min_allow_scale = 1 / max_allow_scale;

  const double min_allow_col_scale = min_allow_scale;
  const double max_allow_col_scale = max_allow_scale;

  if (this->isColwise()) {
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      double col_max_value = 0;
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        col_max_value = max(fabs(this->value_[iEl]), col_max_value);
      if (col_max_value) {
        double col_scale_value = 1 / col_max_value;
        // Convert the col scale factor to the nearest power of two, and
        // ensure that it is not excessively large or small
        col_scale_value = pow(2.0, floor(log(col_scale_value) / log2 + 0.5));
        col_scale_value =
            min(max(min_allow_col_scale, col_scale_value), max_allow_col_scale);
        col_scale[iCol] = col_scale_value;
        // Scale the column
        for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
             iEl++)
          this->value_[iEl] *= col_scale[iCol];
      } else {
        // Empty column
        col_scale[iCol] = 1;
      }
    }
  } else {
    assert(1 == 0);
  }
}